

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.c
# Opt level: O3

uint32_t bitset_container_rank_many
                   (bitset_container_t *container,uint64_t start_rank,uint32_t *begin,uint32_t *end,
                   uint64_t *ans)

{
  uint uVar1;
  uint uVar2;
  uint32_t *puVar3;
  uint32_t *puVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  
  puVar4 = begin;
  if (begin != end) {
    uVar1 = *begin;
    uVar8 = 0;
    iVar6 = 0;
    puVar3 = begin;
    do {
      uVar2 = *puVar3;
      puVar4 = puVar3;
      if (0xffff < (uVar2 ^ uVar1)) break;
      uVar5 = uVar2 >> 6 & 0x3ff;
      if (uVar8 < uVar5) {
        uVar9 = (ulong)uVar8;
        do {
          uVar7 = container->words[uVar9];
          uVar7 = uVar7 - (uVar7 >> 1 & 0x5555555555555555);
          uVar7 = (uVar7 >> 2 & 0x3333333333333333) + (uVar7 & 0x3333333333333333);
          iVar6 = iVar6 + (uint)(byte)(((uVar7 >> 4) + uVar7 & 0xf0f0f0f0f0f0f0f) *
                                       0x101010101010101 >> 0x38);
          uVar9 = uVar9 + 1;
          uVar8 = uVar5;
        } while (uVar5 != uVar9);
      }
      uVar9 = (2L << ((byte)uVar2 & 0x3f)) - 1U & container->words[uVar8];
      uVar9 = uVar9 - (uVar9 >> 1 & 0x5555555555555555);
      uVar9 = (uVar9 >> 2 & 0x3333333333333333) + (uVar9 & 0x3333333333333333);
      *ans = (((uVar9 >> 4) + uVar9 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38) +
             (long)iVar6 + start_rank;
      ans = ans + 1;
      puVar3 = puVar3 + 1;
      puVar4 = end;
    } while (puVar3 != end);
  }
  return (uint32_t)((ulong)((long)puVar4 - (long)begin) >> 2);
}

Assistant:

uint32_t bitset_container_rank_many(const bitset_container_t *container, uint64_t start_rank, const uint32_t* begin, const uint32_t* end, uint64_t* ans){
  const uint16_t high = (uint16_t)((*begin) >> 16);
  int i = 0;
  int sum = 0;
  const uint32_t* iter = begin;
  for(; iter != end; iter++) {
      uint32_t x = *iter;
      uint16_t xhigh = (uint16_t)(x >> 16);
      if(xhigh != high) return iter - begin; // stop at next container

      uint16_t xlow = (uint16_t)x;
      for(int count = xlow / 64; i < count; i++){
        sum += roaring_hamming(container->words[i]);
      }
      uint64_t lastword = container->words[i];
      uint64_t lastpos = UINT64_C(1) << (xlow % 64);
      uint64_t mask = lastpos + lastpos - 1; // smear right
      *(ans++) = start_rank + sum + roaring_hamming(lastword & mask);
  }
  return iter - begin;
}